

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiff_io.cc
# Opt level: O2

void gimage::anon_unknown_6::readUnpacked<float>
               (float *ret,uint32_t n,TiffImage<float> *tif,uint32_t row,uint16_t sample)

{
  uint16_t uVar1;
  pointer puVar2;
  int iVar3;
  byte *pbVar4;
  IOException *pIVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  string sStack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  uVar8 = (ulong)n;
  if ((tif->bits == 0x20) && (tif->is_float != false)) {
    uVar6 = tif->raw_size;
    if ((uVar6 <= uVar8 * 4) && (tif->photometric != 0)) {
      iVar3 = TIFFReadScanline(tif->tif,ret,row,sample);
      if (-1 < iVar3) {
        return;
      }
      pIVar5 = (IOException *)__cxa_allocate_exception(0x28);
      std::__cxx11::to_string(&sStack_88,row);
      std::operator+(&local_68,"Cannot read row ",&sStack_88);
      std::operator+(&local_48,&local_68," of TIFF image");
      gutil::IOException::IOException(pIVar5,&local_48);
      __cxa_throw(pIVar5,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
    }
  }
  else {
    uVar6 = tif->raw_size;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&tif->raw,uVar6);
  iVar3 = TIFFReadScanline(tif->tif,(tif->raw).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,row);
  if (iVar3 < 0) {
    pIVar5 = (IOException *)__cxa_allocate_exception(0x28);
    std::__cxx11::to_string(&sStack_88,row);
    std::operator+(&local_68,"Cannot read row ",&sStack_88);
    std::operator+(&local_48,&local_68," of TIFF image");
    gutil::IOException::IOException(pIVar5,&local_48);
    __cxa_throw(pIVar5,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
  }
  uVar1 = tif->bits;
  if (tif->is_float == true) {
    if (uVar1 == 0x40) {
      puVar2 = (tif->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (tif->photometric == 0) {
        for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
          ret[uVar6] = (float)(1.0 - *(double *)(puVar2 + uVar6 * 8));
        }
      }
      else {
        for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
          ret[uVar6] = (float)*(double *)(puVar2 + uVar6 * 8);
        }
      }
    }
    else {
      if (uVar1 != 0x20) {
        pIVar5 = (IOException *)__cxa_allocate_exception(0x28);
        std::__cxx11::to_string(&sStack_88,(uint)tif->bits);
        std::operator+(&local_68,"Cannot convert TIFF image with ",&sStack_88);
        std::operator+(&local_48,&local_68," bit floating point type");
        gutil::IOException::IOException(pIVar5,&local_48);
        __cxa_throw(pIVar5,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
      }
      puVar2 = (tif->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (tif->photometric == 0) {
        for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
          ret[uVar6] = 1.0 - *(float *)(puVar2 + uVar6 * 4);
        }
      }
      else {
        for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
          ret[uVar6] = *(float *)(puVar2 + uVar6 * 4);
        }
      }
    }
  }
  else {
    switch(uVar1) {
    case 1:
      pbVar4 = (tif->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (tif->photometric == 0) {
        uVar6 = 0;
        while (uVar6 < uVar8) {
          fVar9 = 1.0;
          if ((char)*pbVar4 < '\0') {
            fVar9 = 0.0;
          }
          uVar7 = uVar6 + 1;
          ret[uVar6] = fVar9;
          if (uVar7 < uVar8) {
            ret[uVar6 + 1] = (float)((*pbVar4 & 0x40) == 0);
            uVar7 = uVar6 + 2;
          }
          if (uVar7 < uVar8) {
            ret[uVar7] = (float)((*pbVar4 & 0x20) == 0);
            uVar7 = uVar7 + 1;
          }
          if (uVar7 < uVar8) {
            ret[uVar7] = (float)((*pbVar4 & 0x10) == 0);
            uVar7 = uVar7 + 1;
          }
          if (uVar7 < uVar8) {
            ret[uVar7] = (float)((*pbVar4 & 8) == 0);
            uVar7 = uVar7 + 1;
          }
          if (uVar7 < uVar8) {
            ret[uVar7] = (float)((*pbVar4 & 4) == 0);
            uVar7 = uVar7 + 1;
          }
          if (uVar7 < uVar8) {
            ret[uVar7] = (float)((*pbVar4 & 2) == 0);
            uVar7 = uVar7 + 1;
          }
          if (uVar7 < uVar8) {
            ret[uVar7] = (float)(~*pbVar4 & 1);
            uVar7 = uVar7 + 1;
          }
          pbVar4 = pbVar4 + 1;
          uVar6 = uVar7;
        }
      }
      else {
        uVar6 = 0;
        while (uVar6 < uVar8) {
          uVar7 = uVar6 + 1;
          ret[uVar6] = (float)(*pbVar4 >> 7);
          if (uVar7 < uVar8) {
            ret[uVar6 + 1] = (float)(*pbVar4 >> 6 & 1);
            uVar7 = uVar6 + 2;
          }
          if (uVar7 < uVar8) {
            ret[uVar7] = (float)(*pbVar4 >> 5 & 1);
            uVar7 = uVar7 + 1;
          }
          if (uVar7 < uVar8) {
            ret[uVar7] = (float)(*pbVar4 >> 4 & 1);
            uVar7 = uVar7 + 1;
          }
          if (uVar7 < uVar8) {
            ret[uVar7] = (float)(*pbVar4 >> 3 & 1);
            uVar7 = uVar7 + 1;
          }
          if (uVar7 < uVar8) {
            ret[uVar7] = (float)(*pbVar4 >> 2 & 1);
            uVar7 = uVar7 + 1;
          }
          if (uVar7 < uVar8) {
            ret[uVar7] = (float)(*pbVar4 >> 1 & 1);
            uVar7 = uVar7 + 1;
          }
          if (uVar7 < uVar8) {
            ret[uVar7] = (float)(*pbVar4 & 1);
            uVar7 = uVar7 + 1;
          }
          pbVar4 = pbVar4 + 1;
          uVar6 = uVar7;
        }
      }
      break;
    case 2:
      pbVar4 = (tif->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (tif->photometric == 0) {
        uVar6 = 0;
        while (uVar6 < uVar8) {
          uVar7 = uVar6 + 1;
          ret[uVar6] = (float)((byte)~*pbVar4 >> 6);
          if (uVar7 < uVar8) {
            ret[uVar6 + 1] = (float)((byte)~*pbVar4 >> 4 & 3);
            uVar7 = uVar6 + 2;
          }
          if (uVar7 < uVar8) {
            ret[uVar7] = (float)((byte)~*pbVar4 >> 2 & 3);
            uVar7 = uVar7 + 1;
          }
          if (uVar7 < uVar8) {
            ret[uVar7] = (float)(~*pbVar4 & 3);
            uVar7 = uVar7 + 1;
          }
          pbVar4 = pbVar4 + 1;
          uVar6 = uVar7;
        }
      }
      else {
        uVar6 = 0;
        while (uVar6 < uVar8) {
          uVar7 = uVar6 + 1;
          ret[uVar6] = (float)(*pbVar4 >> 6);
          if (uVar7 < uVar8) {
            ret[uVar6 + 1] = (float)(*pbVar4 >> 4 & 3);
            uVar7 = uVar6 + 2;
          }
          if (uVar7 < uVar8) {
            ret[uVar7] = (float)(*pbVar4 >> 2 & 3);
            uVar7 = uVar7 + 1;
          }
          if (uVar7 < uVar8) {
            ret[uVar7] = (float)(*pbVar4 & 3);
            uVar7 = uVar7 + 1;
          }
          pbVar4 = pbVar4 + 1;
          uVar6 = uVar7;
        }
      }
      break;
    case 3:
    case 5:
    case 6:
    case 7:
switchD_0013c31a_caseD_3:
      pIVar5 = (IOException *)__cxa_allocate_exception(0x28);
      std::__cxx11::to_string(&sStack_88,(uint)tif->bits);
      std::operator+(&local_68,"Cannot convert TIFF image with ",&sStack_88);
      std::operator+(&local_48,&local_68," bit integer type");
      gutil::IOException::IOException(pIVar5,&local_48);
      __cxa_throw(pIVar5,&gutil::IOException::typeinfo,gutil::Exception::~Exception);
    case 4:
      pbVar4 = (tif->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (tif->photometric == 0) {
        uVar6 = 0;
        while (uVar6 < uVar8) {
          ret[uVar6] = (float)((byte)~*pbVar4 >> 4);
          uVar7 = uVar6 + 1;
          if (uVar6 + 1 < uVar8) {
            ret[uVar6 + 1] = (float)(~*pbVar4 & 0xf);
            uVar7 = uVar6 + 2;
          }
          uVar6 = uVar7;
          pbVar4 = pbVar4 + 1;
        }
      }
      else {
        uVar6 = 0;
        while (uVar6 < uVar8) {
          ret[uVar6] = (float)(*pbVar4 >> 4);
          uVar7 = uVar6 + 1;
          if (uVar6 + 1 < uVar8) {
            ret[uVar6 + 1] = (float)(*pbVar4 & 0xf);
            uVar7 = uVar6 + 2;
          }
          uVar6 = uVar7;
          pbVar4 = pbVar4 + 1;
        }
      }
      break;
    case 8:
      puVar2 = (tif->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (tif->photometric == 0) {
        for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
          ret[uVar6] = (float)(byte)~puVar2[uVar6];
        }
      }
      else {
        for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
          ret[uVar6] = (float)puVar2[uVar6];
        }
      }
      break;
    default:
      if (uVar1 == 0x10) {
        puVar2 = (tif->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (tif->photometric == 0) {
          for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
            ret[uVar6] = (float)(*(ushort *)(puVar2 + uVar6 * 2) ^ 0xffff);
          }
        }
        else {
          for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
            ret[uVar6] = (float)*(ushort *)(puVar2 + uVar6 * 2);
          }
        }
      }
      else {
        if (uVar1 != 0x20) goto switchD_0013c31a_caseD_3;
        puVar2 = (tif->raw).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (tif->photometric == 0) {
          for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
            ret[uVar6] = (float)~*(uint *)(puVar2 + uVar6 * 4);
          }
        }
        else {
          for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
            ret[uVar6] = (float)*(uint *)(puVar2 + uVar6 * 4);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void readUnpacked(T *ret, uint32_t n, TiffImage<T> &tif, uint32_t row, uint16_t sample)
{
  if (tif.bits != 8*sizeof(T) || tif.is_float != std::is_floating_point<T>::value ||
    n*sizeof(T) < tif.raw_size || tif.photometric == PHOTOMETRIC_MINISWHITE)
  {
    // converting row value wise

    tif.raw.resize(tif.raw_size);

    if (TIFFReadScanline(tif.tif, tif.raw.data(), row, sample) < 0)
    {
      throw gutil::IOException("Cannot read row "+std::to_string(row)+" of TIFF image");
    }

    if (tif.is_float)
    {
      if (tif.bits == 32)
      {
        float *p=reinterpret_cast<float *>(tif.raw.data());

        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          for (uint32_t i=0; i<n; i++) ret[i]=static_cast<T>(1.0f-p[i]);
        }
        else
        {
          for (uint32_t i=0; i<n; i++) ret[i]=static_cast<T>(p[i]);
        }
      }
      else if (tif.bits == 64)
      {
        double *p=reinterpret_cast<double *>(tif.raw.data());

        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          for (uint32_t i=0; i<n; i++) ret[i]=static_cast<T>(1.0-p[i]);
        }
        else
        {
          for (uint32_t i=0; i<n; i++) ret[i]=static_cast<T>(p[i]);
        }
      }
      else
      {
        throw gutil::IOException("Cannot convert TIFF image with "+std::to_string(tif.bits)+" bit floating point type");
      }
    }
    else
    {
      if (tif.bits == 1)
      {
        uint8_t *p=reinterpret_cast<uint8_t *>(tif.raw.data());

        size_t i=0;
        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          while (i < n)
          {
            ret[i++]=static_cast<T>(1-((*p>>7) & 0x1));
            if (i < n) ret[i++]=static_cast<T>(1-((*p>>6) & 0x1));
            if (i < n) ret[i++]=static_cast<T>(1-((*p>>5) & 0x1));
            if (i < n) ret[i++]=static_cast<T>(1-((*p>>4) & 0x1));
            if (i < n) ret[i++]=static_cast<T>(1-((*p>>3) & 0x1));
            if (i < n) ret[i++]=static_cast<T>(1-((*p>>2) & 0x1));
            if (i < n) ret[i++]=static_cast<T>(1-((*p>>1) & 0x1));
            if (i < n) ret[i++]=static_cast<T>(1-(*p & 0x1));
            p++;
          }
        }
        else
        {
          while (i < n)
          {
            ret[i++]=static_cast<T>((*p>>7) & 0x1);
            if (i < n) ret[i++]=static_cast<T>((*p>>6) & 0x1);
            if (i < n) ret[i++]=static_cast<T>((*p>>5) & 0x1);
            if (i < n) ret[i++]=static_cast<T>((*p>>4) & 0x1);
            if (i < n) ret[i++]=static_cast<T>((*p>>3) & 0x1);
            if (i < n) ret[i++]=static_cast<T>((*p>>2) & 0x1);
            if (i < n) ret[i++]=static_cast<T>((*p>>1) & 0x1);
            if (i < n) ret[i++]=static_cast<T>(*p & 0x1);
            p++;
          }
        }
      }
      else if (tif.bits == 2)
      {
        uint8_t *p=reinterpret_cast<uint8_t *>(tif.raw.data());

        size_t i=0;
        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          while (i < n)
          {
            ret[i++]=static_cast<T>(3-((*p>>6) & 0x3));
            if (i < n) ret[i++]=static_cast<T>(3-((*p>>4) & 0x3));
            if (i < n) ret[i++]=static_cast<T>(3-((*p>>2) & 0x3));
            if (i < n) ret[i++]=static_cast<T>(3-(*p & 0x3));
            p++;
          }
        }
        else
        {
          while (i < n)
          {
            ret[i++]=static_cast<T>((*p>>6) & 0x3);
            if (i < n) ret[i++]=static_cast<T>((*p>>4) & 0x3);
            if (i < n) ret[i++]=static_cast<T>((*p>>2) & 0x3);
            if (i < n) ret[i++]=static_cast<T>(*p & 0x3);
            p++;
          }
        }
      }
      else if (tif.bits == 4)
      {
        uint8_t *p=reinterpret_cast<uint8_t *>(tif.raw.data());

        size_t i=0;
        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          while (i < n)
          {
            ret[i++]=static_cast<T>(15-((*p>>4) & 0xf));
            if (i < n) ret[i++]=static_cast<T>(15-(*p & 0xf));
            p++;
          }
        }
        else
        {
          while (i < n)
          {
            ret[i++]=static_cast<T>((*p>>4) & 0xf);
            if (i < n) ret[i++]=static_cast<T>(*p & 0xf);
            p++;
          }
        }
      }
      else if (tif.bits == 8)
      {
        uint8_t *p=reinterpret_cast<uint8_t *>(tif.raw.data());
        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          for (size_t i=0; i<n; i++) ret[i]=static_cast<T>(255-p[i]);
        }
        else
        {
          for (size_t i=0; i<n; i++) ret[i]=static_cast<T>(p[i]);
        }
      }
      else if (tif.bits == 16)
      {
        uint16_t *p=reinterpret_cast<uint16_t *>(tif.raw.data());
        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          for (size_t i=0; i<n; i++) ret[i]=static_cast<T>(65535-p[i]);
        }
        else
        {
          for (size_t i=0; i<n; i++) ret[i]=static_cast<T>(p[i]);
        }
      }
      else if (tif.bits == 32)
      {
        uint32_t *p=reinterpret_cast<uint32_t *>(tif.raw.data());
        if (tif.photometric == PHOTOMETRIC_MINISWHITE)
        {
          for (size_t i=0; i<n; i++) ret[i]=static_cast<T>(4294967295-p[i]);
        }
        else
        {
          for (size_t i=0; i<n; i++) ret[i]=static_cast<T>(p[i]);
        }
      }
      else
      {
        throw gutil::IOException("Cannot convert TIFF image with "+std::to_string(tif.bits)+" bit integer type");
      }
    }
  }
  else
  {
    if (TIFFReadScanline(tif.tif, ret, row, sample) < 0)
    {
      throw gutil::IOException("Cannot read row "+std::to_string(row)+" of TIFF image");
    }
  }
}